

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqstate.cpp
# Opt level: O1

void __thiscall RefTable::Finalize(RefTable *this)

{
  SQUnsignedInteger *pSVar1;
  SQObjectType SVar2;
  SQTable *pSVar3;
  RefNode *pRVar4;
  ulong uVar5;
  
  if (this->_numofslots != 0) {
    pRVar4 = this->_nodes;
    uVar5 = 0;
    do {
      pSVar3 = (pRVar4->obj).super_SQObject._unVal.pTable;
      SVar2 = (pRVar4->obj).super_SQObject._type;
      (pRVar4->obj).super_SQObject._type = OT_NULL;
      (pRVar4->obj).super_SQObject._unVal.pTable = (SQTable *)0x0;
      if ((SVar2 >> 0x1b & 1) != 0) {
        pSVar1 = &(pSVar3->super_SQDelegable).super_SQCollectable.super_SQRefCounted._uiRef;
        *pSVar1 = *pSVar1 - 1;
        if (*pSVar1 == 0) {
          (*(pSVar3->super_SQDelegable).super_SQCollectable.super_SQRefCounted._vptr_SQRefCounted[2]
          )();
        }
      }
      pRVar4 = pRVar4 + 1;
      uVar5 = uVar5 + 1;
    } while (uVar5 < this->_numofslots);
  }
  return;
}

Assistant:

void RefTable::Finalize()
{
    RefNode *nodes = _nodes;
    for(SQUnsignedInteger n = 0; n < _numofslots; n++) {
        nodes->obj.Null();
        nodes++;
    }
}